

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_traverse_dashed
               (plutovg_path_t *path,float offset,float *dashes,int ndashes,
               plutovg_path_traverse_func_t traverse_func,void *closure)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float __y;
  float *local_60;
  int local_58;
  float local_54;
  float local_50;
  int local_4c;
  int local_48;
  byte local_44;
  byte local_43;
  undefined8 local_40;
  plutovg_path_traverse_func_t local_38;
  void *local_30;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < ndashes) {
    uVar3 = (ulong)(uint)ndashes;
  }
  __y = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    __y = __y + dashes[uVar2];
  }
  if ((ndashes & 0x80000001U) == 1) {
    __y = __y + __y;
  }
  if (0.0 < __y) {
    local_60 = dashes;
    local_58 = ndashes;
    fVar4 = fmodf(offset,__y);
    local_4c = 0;
    local_44 = 1;
    for (local_54 = (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
                           (uint)(__y + fVar4) & -(uint)(fVar4 < 0.0));
        (0.0 < local_54 &&
        (lVar1 = (long)local_4c, dashes[lVar1 % (long)ndashes & 0xffffffff] <= local_54));
        local_54 = local_54 - dashes[lVar1 % (long)ndashes & 0xffffffff]) {
      local_44 = local_44 ^ 1;
      local_4c = local_4c + 1;
    }
    local_40 = 0;
    local_50 = local_54;
    local_48 = local_4c;
    local_43 = local_44;
    local_38 = traverse_func;
    local_30 = closure;
    plutovg_path_traverse_flatten(path,dash_traverse_func,&local_60);
    return;
  }
  plutovg_path_traverse(path,traverse_func,closure);
  return;
}

Assistant:

void plutovg_path_traverse_dashed(const plutovg_path_t* path, float offset, const float* dashes, int ndashes, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float dash_sum = 0.f;
    for(int i = 0; i < ndashes; ++i)
        dash_sum += dashes[i];
    if(ndashes % 2 == 1)
        dash_sum *= 2.f;
    if(dash_sum <= 0.f) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    dasher_t dasher;
    dasher.dashes = dashes;
    dasher.ndashes = ndashes;
    dasher.start_phase = fmodf(offset, dash_sum);
    if(dasher.start_phase < 0.f)
        dasher.start_phase += dash_sum;
    dasher.start_index = 0;
    dasher.start_toggle = true;
    while(dasher.start_phase > 0.f && dasher.start_phase >= dasher.dashes[dasher.start_index % dasher.ndashes]) {
        dasher.start_phase -= dashes[dasher.start_index % dasher.ndashes];
        dasher.start_toggle = !dasher.start_toggle;
        dasher.start_index++;
    }

    dasher.phase = dasher.start_phase;
    dasher.index = dasher.start_index;
    dasher.toggle = dasher.start_toggle;
    dasher.current_point = PLUTOVG_EMPTY_POINT;
    dasher.traverse_func = traverse_func;
    dasher.closure = closure;
    plutovg_path_traverse_flatten(path, dash_traverse_func, &dasher);
}